

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void jpgd::jpeg_decoder::decode_block_ac_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  jpeg_decoder *this;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  jpeg_decoder *in_RDI;
  jpgd_block_t *p;
  int r;
  int s;
  int k;
  jpgd_status in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  int local_18;
  
  if (in_RDI->m_eob_run == 0) {
    this = (jpeg_decoder *)coeff_buf_getp(in_RDI,in_RDI->m_ac_coeffs[in_ESI],in_EDX,in_ECX);
    for (local_18 = in_RDI->m_spectral_start; local_18 <= in_RDI->m_spectral_end;
        local_18 = local_18 + 1) {
      uVar1 = huff_decode((jpeg_decoder *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (huff_tables *)this);
      iVar2 = (int)uVar1 >> 4;
      uVar1 = uVar1 & 0xf;
      if (uVar1 == 0) {
        if (iVar2 != 0xf) {
          in_RDI->m_eob_run = 1 << ((byte)iVar2 & 0x1f);
          if (iVar2 != 0) {
            uVar3 = get_bits_no_markers(this,in_stack_ffffffffffffffd4);
            in_RDI->m_eob_run = uVar3 + in_RDI->m_eob_run;
          }
          in_RDI->m_eob_run = in_RDI->m_eob_run + -1;
          return;
        }
        local_18 = local_18 + 0xf;
        if (0x3f < local_18) {
          stop_decoding((jpeg_decoder *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
        }
        in_stack_ffffffffffffffe4 = 0;
        in_stack_ffffffffffffffe0 = 0xf;
      }
      else {
        local_18 = iVar2 + local_18;
        if (0x3f < local_18) {
          stop_decoding((jpeg_decoder *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
        }
        in_stack_ffffffffffffffe0 = get_bits_no_markers(this,in_stack_ffffffffffffffd4);
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffe0;
        if ((int)in_stack_ffffffffffffffe0 < *(int *)(s_extend_test + (long)(int)(uVar1 & 0xf) * 4))
        {
          in_stack_ffffffffffffffd4 =
               in_stack_ffffffffffffffe0 + *(int *)(s_extend_offset + (long)(int)(uVar1 & 0xf) * 4);
        }
        *(short *)((long)this->m_jmp_state[0].__jmpbuf +
                  (long)*(int *)(g_ZAG + (long)local_18 * 4) * 2) =
             (short)(in_stack_ffffffffffffffd4 << ((byte)in_RDI->m_successive_low & 0x1f));
        in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffd4;
      }
    }
  }
  else {
    in_RDI->m_eob_run = in_RDI->m_eob_run + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_first(jpeg_decoder* pD, int component_id, int block_x, int block_y) {
  int k, s, r;

  if (pD->m_eob_run) {
    pD->m_eob_run--;
    return;
  }

  jpgd_block_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);

  for (k = pD->m_spectral_start; k <= pD->m_spectral_end; k++) {
    s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);

    r = s >> 4;
    s &= 15;

    if (s) {
      if ((k += r) > 63)
        pD->stop_decoding(JPGD_DECODE_ERROR);

      r = pD->get_bits_no_markers(s);
      s = JPGD_HUFF_EXTEND(r, s);

      p[g_ZAG[k]] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
    } else {
      if (r == 15) {
        if ((k += 15) > 63)
          pD->stop_decoding(JPGD_DECODE_ERROR);
      } else {
        pD->m_eob_run = 1 << r;

        if (r)
          pD->m_eob_run += pD->get_bits_no_markers(r);

        pD->m_eob_run--;

        break;
      }
    }
  }
}